

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::Graph(Graph *this,uint64_t n,uint64_t m)

{
  ulong uVar1;
  iterator iVar2;
  uint64_t i;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  ulong local_100;
  uint64_t u;
  Graph *local_f0;
  uniform_int_distribution<unsigned_long> vertex;
  uint64_t index;
  unordered_set<Graph::LightEdge,_std::hash<Graph::LightEdge>,_std::equal_to<Graph::LightEdge>,_std::allocator<Graph::LightEdge>_>
  helper;
  uniform_int_distribution<unsigned_long> randomVertex;
  anon_class_40_5_88fd879f addEdge;
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->matrix,n,(allocator_type *)&helper);
  helper._M_h._M_element_count = 0;
  helper._M_h._M_buckets = (__buckets_ptr)0x0;
  helper._M_h._M_bucket_count = 0;
  helper._M_h._M_before_begin._M_nxt = helper._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
  local_f0 = this;
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            (&this->edges,m,(value_type *)&helper,(allocator_type *)&addEdge);
  helper._M_h._M_buckets = (__buckets_ptr)((ulong)helper._M_h._M_buckets & 0xffffffff00000000);
  std::vector<Graph::Colors,_std::allocator<Graph::Colors>_>::vector
            (&this->colorMap,n,(value_type *)&helper,(allocator_type *)&addEdge);
  helper._M_h._M_buckets = (__buckets_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->sums,n,(value_type_conflict *)&helper,(allocator_type *)&addEdge);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->time_discover,n,(allocator_type *)&helper);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->time_minimal,n,(allocator_type *)&helper);
  (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  randomVertex._M_param._M_a = 0;
  index = 0;
  helper._M_h._M_buckets = &helper._M_h._M_single_bucket;
  helper._M_h._M_bucket_count = 1;
  helper._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  helper._M_h._M_element_count = 0;
  helper._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  auVar5._8_4_ = (int)(m >> 0x20);
  auVar5._0_8_ = m;
  auVar5._12_4_ = 0x45300000;
  helper._M_h._M_rehash_policy._M_next_resize = 0;
  helper._M_h._M_single_bucket = (__node_base_ptr)0x0;
  dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)m) - 4503599627370496.0)) * 2.2;
  uVar1 = (ulong)dVar4;
  randomVertex._M_param._M_b = n - 1;
  std::__detail::
  _Rehash_base<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_std::integral_constant<bool,_true>_>
             *)&helper,(long)(dVar4 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1);
  addEdge.u = &u;
  addEdge.v = &local_100;
  addEdge.index = &index;
  addEdge.helper = &helper;
  addEdge.this = this;
  for (local_100 = 1; local_100 <= n - 1; local_100 = local_100 + 1) {
    vertex._M_param._M_b = local_100 - 1;
    vertex._M_param._M_a = 0;
    u = std::uniform_int_distribution<unsigned_long>::operator()(&vertex,&engine);
    Graph::anon_class_40_5_88fd879f::operator()(&addEdge);
  }
  for (lVar3 = 0; lVar3 != (m - n) + 1; lVar3 = lVar3 + 1) {
    do {
      u = std::uniform_int_distribution<unsigned_long>::operator()(&randomVertex,&engine);
      local_100 = std::uniform_int_distribution<unsigned_long>::operator()(&randomVertex,&engine);
      vertex._M_param._M_a = u;
      vertex._M_param._M_b = local_100;
      iVar2 = std::
              _Hashtable<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&helper._M_h,(key_type *)&vertex);
      if (iVar2.super__Node_iterator_base<Graph::LightEdge,_true>._M_cur != (__node_type *)0x0) {
        u = local_100;
      }
    } while (u == local_100);
    Graph::anon_class_40_5_88fd879f::operator()(&addEdge);
  }
  std::
  _Hashtable<Graph::LightEdge,_Graph::LightEdge,_std::allocator<Graph::LightEdge>,_std::__detail::_Identity,_std::equal_to<Graph::LightEdge>,_std::hash<Graph::LightEdge>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&helper._M_h);
  return;
}

Assistant:

Graph::Graph(std::uint64_t n, std::uint64_t m)
    : matrix(n), edges(m, Edge(0, 0, false, 0)), colorMap(n, Colors::White),
      sums(n, 0), time_discover(n), time_minimal(n) {
    std::uniform_int_distribution<std::uint64_t> randomVertex(0, n - 1);
    std::uint64_t u, v, index = 0;

    std::unordered_set<LightEdge> helper;
    helper.reserve(2.2 * m);

    auto addEdge = [&]() {
        helper.emplace(u, v);
        helper.emplace(v, u);
        matrix[u].push_back(index);
        matrix[v].push_back(index);
        edges[index].v = v;
        edges[index++].u = u;
    };

    for (v = 1; v <= n - 1; ++v) {
        std::uniform_int_distribution<std::uint64_t> vertex(0, v - 1);
        u = vertex(engine);
        addEdge();
    }

    for (std::uint64_t i = 0; i < m - n + 1; ++i) {
        do {
            u = randomVertex(engine);
            v = randomVertex(engine);
            auto it = helper.find(LightEdge{u, v});
            if (it != helper.end())
                u = v;
        } while (u == v);

        addEdge();
    }
}